

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# net.cpp
# Opt level: O0

int __thiscall ncnn::Extractor::extract(Extractor *this,int blob_index,Mat *feat)

{
  size_type sVar1;
  reference pvVar2;
  const_reference pvVar3;
  int in_ESI;
  Mat *in_RDI;
  int layer_index;
  int ret;
  Option *in_stack_00000210;
  vector<ncnn::Mat,_std::allocator<ncnn::Mat>_> *in_stack_00000218;
  int in_stack_00000224;
  Net *in_stack_00000228;
  int in_stack_ffffffffffffffd8;
  int iVar4;
  
  if ((-1 < in_ESI) &&
     (sVar1 = std::vector<ncnn::Mat,_std::allocator<ncnn::Mat>_>::size
                        ((vector<ncnn::Mat,_std::allocator<ncnn::Mat>_> *)&in_RDI->refcount),
     in_ESI < (int)sVar1)) {
    iVar4 = 0;
    pvVar2 = std::vector<ncnn::Mat,_std::allocator<ncnn::Mat>_>::operator[]
                       ((vector<ncnn::Mat,_std::allocator<ncnn::Mat>_> *)&in_RDI->refcount,
                        (long)in_ESI);
    if (pvVar2->dims == 0) {
      pvVar3 = std::vector<ncnn::Blob,_std::allocator<ncnn::Blob>_>::operator[]
                         ((vector<ncnn::Blob,_std::allocator<ncnn::Blob>_> *)
                          ((long)in_RDI->data + 0x10),(long)in_ESI);
      in_stack_ffffffffffffffd8 = pvVar3->producer;
      iVar4 = Net::forward_layer(in_stack_00000228,in_stack_00000224,in_stack_00000218,
                                 in_stack_00000210);
    }
    std::vector<ncnn::Mat,_std::allocator<ncnn::Mat>_>::operator[]
              ((vector<ncnn::Mat,_std::allocator<ncnn::Mat>_> *)&in_RDI->refcount,(long)in_ESI);
    Mat::operator=((Mat *)CONCAT44(iVar4,in_stack_ffffffffffffffd8),in_RDI);
    return iVar4;
  }
  return -1;
}

Assistant:

int Extractor::extract(int blob_index, Mat& feat)
{
    if (blob_index < 0 || blob_index >= (int)blob_mats.size())
        return -1;

    int ret = 0;

    if (blob_mats[blob_index].dims == 0)
    {
        int layer_index = net->blobs[blob_index].producer;

#if NCNN_VULKAN
        if (opt.vulkan_compute)
        {
            ncnn::VkCompute cmd(net->vkdev);
#if NCNN_BENCHMARK
            cmd.create_query_pool(net->layers.size() * 2);
#endif // NCNN_BENCHMARK

            VkMat feat_gpu;
            ret = extract(blob_index, feat_gpu, cmd);

            if (blob_mats[blob_index].dims == 0 && feat_gpu.dims != 0)
            {
                // unpacking
                VkMat feat_gpu_unpacked;
                net->packing_pack1->forward(feat_gpu, feat_gpu_unpacked, cmd, opt);

                // cast to fp32
                VkMat feat_gpu_unpacked_fp32;
                if (net->vkdev->info.support_fp16_packed || net->vkdev->info.support_fp16_storage)
                {
                    net->cast_float16_to_float32->forward(feat_gpu_unpacked, feat_gpu_unpacked_fp32, cmd, opt);
                }
                else
                {
                    feat_gpu_unpacked_fp32 = feat_gpu_unpacked;
                }

                // download
                feat_gpu_unpacked_fp32.prepare_staging_buffer();
                cmd.record_download(feat_gpu_unpacked_fp32);

                cmd.submit_and_wait();

#if NCNN_BENCHMARK
                std::vector<uint64_t> results(net->layers.size() * 2);
                cmd.get_query_pool_results(0, net->layers.size() * 2, results);
                for (int i=0; i<net->layers.size(); i++)
                {
                    uint64_t start = results[i*2];
                    uint64_t end = results[i*2+1];
                    if (start == 0 || end == 0)
                        continue;

                    double duration_us = (end - start) * net->vkdev->info.timestamp_period / 1000;
                    fprintf(stderr, "%-24s %-30s %8.2lfus    |\n", net->layers[i]->type.c_str(), net->layers[i]->name.c_str(), duration_us);
                }
#endif // NCNN_BENCHMARK

                Mat& feat_cpu = blob_mats[blob_index];
                feat_cpu.create_like(feat_gpu_unpacked_fp32, opt.blob_allocator);
                feat_gpu_unpacked_fp32.download(feat_cpu);

                feat_gpu_unpacked_fp32.discard_staging_buffer();
            }
        }
        else
        {
            ret = net->forward_layer(layer_index, blob_mats, opt);
        }
#else
        ret = net->forward_layer(layer_index, blob_mats, opt);
#endif // NCNN_VULKAN

    }

    feat = blob_mats[blob_index];

    return ret;
}